

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall pbrt::RGBFilm::WriteImage(RGBFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image *in_RSI;
  Image image;
  ImageMetadata *in_stack_00000710;
  string *in_stack_00000718;
  Image *in_stack_00000720;
  Bounds2<int> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  LogLevel in_stack_ffffffffffffff14;
  
  GetImage((RGBFilm *)image.channelNames.field_2._16_8_,
           (ImageMetadata *)image.channelNames.field_2.fixed[0]._M_string_length,
           (Float)image.channelNames.field_2._4_4_);
  if (LOGGING_LogLevel < 1) {
    Log<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  Image::Write(in_stack_00000720,in_stack_00000718,in_stack_00000710);
  Image::~Image(in_RSI);
  return;
}

Assistant:

void RGBFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}